

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O2

void __thiscall
OpenMD::SquareMatrix3<double>::setupRotMat
          (SquareMatrix3<double> *this,double w,double x,double y,double z)

{
  Quaternion<double> q;
  Vector<double,_4U> local_80;
  SquareMatrix<double,_3> local_60;
  
  Vector<double,_4U>::Vector(&local_80);
  local_80.data_[0] = w;
  local_80.data_[1] = x;
  local_80.data_[2] = y;
  local_80.data_[3] = z;
  Quaternion<double>::toRotationMatrix3(&local_60,(Quaternion<double> *)&local_80);
  operator=(this,&local_60);
  return;
}

Assistant:

void setupRotMat(Real w, Real x, Real y, Real z) {
      Quaternion<Real> q(w, x, y, z);
      *this = q.toRotationMatrix3();
    }